

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Attach_File(FT_Face face,char *filepathname)

{
  undefined1 local_60 [8];
  FT_Open_Args open;
  char *filepathname_local;
  FT_Face face_local;
  
  if (filepathname == (char *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    open.pathname = (FT_String *)0x0;
    local_60._0_4_ = 4;
    open.memory_size = (FT_Long)filepathname;
    open.params = (FT_Parameter *)filepathname;
    face_local._4_4_ = FT_Attach_Stream(face,(FT_Open_Args *)local_60);
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Attach_File( FT_Face      face,
                  const char*  filepathname )
  {
    FT_Open_Args  open;


    /* test for valid `face' delayed to `FT_Attach_Stream' */

    if ( !filepathname )
      return FT_THROW( Invalid_Argument );

    open.stream   = NULL;
    open.flags    = FT_OPEN_PATHNAME;
    open.pathname = (char*)filepathname;

    return FT_Attach_Stream( face, &open );
  }